

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_inc_helper_polar<ExchCXX::BuiltinR2SCAN_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  long lVar1;
  const_host_buffer_type pdVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  double e;
  double local_38;
  
  if (0 < N) {
    pdVar2 = sigma + 2;
    lVar1 = 0;
    do {
      auVar4 = *(undefined1 (*) [16])((long)rho + lVar1 * 2);
      dVar5 = 0.0;
      if (1e-11 < auVar4._8_8_ + auVar4._0_8_) {
        auVar9 = maxpd(_DAT_0101f620,*(undefined1 (*) [16])((long)tau + lVar1 * 2));
        auVar7._8_8_ = *pdVar2;
        auVar7._0_8_ = pdVar2[-2];
        auVar4 = maxpd(_DAT_0101f640,auVar4);
        auVar7 = maxpd(_DAT_0101f650,auVar7);
        auVar6._0_8_ = auVar4._0_8_ * 8.0 * auVar9._0_8_;
        auVar6._8_8_ = auVar4._8_8_ * 8.0 * auVar9._8_8_;
        auVar6 = minpd(auVar6,auVar7);
        dVar8 = (auVar6._8_8_ + auVar6._0_8_) * 0.5;
        uVar3 = -(ulong)(-dVar8 <= pdVar2[-1]);
        dVar5 = (double)(uVar3 & (ulong)pdVar2[-1] | ~uVar3 & (ulong)-dVar8);
        uVar3 = -(ulong)(dVar5 <= dVar8);
        kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_polar_impl
                  (auVar4._0_8_,auVar4._8_8_,auVar6._0_8_,
                   (double)(~uVar3 & (ulong)dVar8 | uVar3 & (ulong)dVar5),auVar6._8_8_,0.0,0.0,
                   auVar9._0_8_,auVar9._8_8_,&local_38);
        dVar5 = local_38;
      }
      *(double *)((long)eps + lVar1) = dVar5 * scal_fact + *(double *)((long)eps + lVar1);
      pdVar2 = pdVar2 + 3;
      lVar1 = lVar1 + 8;
    } while ((ulong)(uint)N << 3 != lVar1);
  }
  return;
}

Assistant:

MGGA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i   = rho   + 2*i;
    auto* sigma_i = sigma + 3*i;
    auto* tau_i   = tau   + 2*i;
    auto* lapl_i  = lapl  + 2*i;

    const auto lapl_i_a = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const auto lapl_i_b = traits::needs_laplacian ? lapl_i[1] : 0.0;
   
    double e;
    traits::eval_exc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_i_a, lapl_i_b, tau_i[0], tau_i[1], 
      e );
    eps[i] += scal_fact * e;

  }

}